

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O1

_Bool PPC_getInstruction(csh ud,uint8_t *code,size_t code_len,MCInst *instr,uint16_t *size,
                        uint64_t address,void *info)

{
  byte bVar1;
  cs_detail *__s;
  long lVar2;
  uint8_t *puVar3;
  uint uVar4;
  DecodeStatus DVar5;
  uint8_t *orig_p;
  byte bVar6;
  uint uVar7;
  uint64_t Address;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint8_t *orig_p_2;
  uint8_t *puVar11;
  ulong uVar12;
  byte *pbVar13;
  uint64_t Value_4;
  uint8_t *orig_p_1;
  DecodeStatus local_3c;
  
  if (code_len < 4) {
    *size = 0;
    return false;
  }
  if (instr->csh->mode < CS_MODE_ARM) {
    uVar4 = (uint)code[2] << 8 | (uint)code[1] << 0x10 | (uint)*code << 0x18;
    code = code + 3;
  }
  else {
    uVar4 = (uint)code[1] << 8 | (uint)code[2] << 0x10 | (uint)code[3] << 0x18;
  }
  uVar4 = *code | uVar4;
  __s = instr->flat_insn->detail;
  if (__s != (cs_detail *)0x0) {
    memset(__s,0,0x5f8);
  }
  uVar7 = 0;
  local_3c = MCDisassembler_Success;
  Address = 0xffffffff;
  puVar3 = DecoderTable32;
  do {
    puVar11 = puVar3;
    switch(*puVar11) {
    case '\x01':
      uVar7 = ~(-1 << (puVar11[2] & 0x1f)) << (puVar11[1] & 0x1f);
      if (puVar11[2] == 0x20) {
        uVar7 = 0xffffffff;
      }
      uVar7 = (uVar7 & uVar4) >> (puVar11[1] & 0x1f);
      puVar3 = puVar11 + 3;
      break;
    case '\x02':
      uVar10 = 0;
      address = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar10 + 1;
        address = address + ((puVar11[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      puVar3 = puVar11 + (uVar10 & 0xffffffff) + 3;
      if (uVar7 != (uint)address) {
        puVar3 = puVar11 + (uVar10 & 0xffffffff) + 3 +
                 *(ushort *)(puVar11 + (uVar10 & 0xffffffff) + 1);
      }
      break;
    case '\x03':
      uVar9 = ~(-1 << (puVar11[2] & 0x1f)) << (puVar11[1] & 0x1f);
      uVar10 = 0;
      address = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar10 + 3;
        address = address + ((puVar11[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      if (puVar11[2] == 0x20) {
        uVar9 = 0xffffffff;
      }
      puVar3 = puVar11 + (uVar10 & 0xffffffff) + 5;
      if ((uVar9 & uVar4) >> (puVar11[1] & 0x1f) != (uint)address) {
        puVar3 = puVar11 + (uVar10 & 0xffffffff) + 5 +
                 *(ushort *)(puVar11 + (uVar10 & 0xffffffff) + 3);
      }
      break;
    case '\x04':
      uVar10 = 0;
      do {
        lVar2 = uVar10 + 1;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      puVar3 = puVar11 + (uVar10 & 0xffffffff) + 3;
      break;
    case '\x05':
      uVar10 = 0;
      uVar7 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar10 + 1;
        uVar7 = uVar7 + ((puVar11[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      pbVar13 = puVar11 + (uVar10 & 0xffffffff) + 1;
      uVar9 = 0;
      bVar6 = 0;
      do {
        bVar1 = *pbVar13;
        uVar9 = uVar9 + ((bVar1 & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        pbVar13 = pbVar13 + 1;
      } while ((char)bVar1 < '\0');
      MCInst_setOpcode(instr,uVar7);
      DVar5 = decodeToMCInst_4(local_3c,uVar9,uVar4,instr,Address,(void *)address);
LAB_001908a1:
      if (DVar5 == MCDisassembler_Fail) {
        MCInst_clear(instr);
        *size = 0;
      }
      else {
        *size = 4;
      }
      return DVar5 == MCDisassembler_Success;
    case '\x06':
      uVar10 = 0;
      uVar9 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar10 + 1;
        uVar9 = uVar9 + ((puVar11[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar10 = uVar10 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      uVar12 = 0;
      uVar8 = 0;
      bVar6 = 0;
      do {
        lVar2 = uVar12 + (uVar10 & 0xffffffff) + 1;
        uVar8 = uVar8 + ((puVar11[lVar2] & 0x7f) << (bVar6 & 0x1f));
        bVar6 = bVar6 + 7;
        uVar12 = uVar12 + 1;
      } while ((char)puVar11[lVar2] < '\0');
      uVar9 = uVar8 & ~uVar4 | uVar9 & uVar4;
      address = (uint64_t)uVar9;
      puVar3 = puVar11 + (uVar12 & 0xffffffff) + (uVar10 & 0xffffffff) + 1;
      if (uVar9 != 0) {
        local_3c = MCDisassembler_SoftFail;
      }
      break;
    default:
      DVar5 = MCDisassembler_Fail;
      goto LAB_001908a1;
    }
  } while( true );
}

Assistant:

static DecodeStatus getInstruction(MCInst *MI,
		const uint8_t *code, size_t code_len,
		uint16_t *Size,
		uint64_t Address, MCRegisterInfo *MRI)
{
	uint32_t insn;
	DecodeStatus result;
	// Get the four bytes of the instruction.
	if (code_len < 4) {
		// not enough data
		*Size = 0;
		return MCDisassembler_Fail;
	}

	// The instruction is big-endian encoded.
	if (MI->csh->mode & CS_MODE_BIG_ENDIAN)
		insn = (code[0] << 24) | (code[1] << 16) |
			(code[2] <<  8) | (code[3] <<  0);
	else
		insn = (code[3] << 24) | (code[2] << 16) |
			(code[1] <<  8) | (code[0] <<  0);

	if (MI->flat_insn->detail) {
		memset(MI->flat_insn->detail, 0, sizeof(cs_detail));
	}

	result = decodeInstruction_4(DecoderTable32, MI, insn, Address, 4);
	if (result != MCDisassembler_Fail) {
		*Size = 4;
		return result;
	}

	// report error
	MCInst_clear(MI);
	*Size = 0;
	return MCDisassembler_Fail;
}